

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservableDictionaryExample.cpp
# Opt level: O1

void __thiscall Random::Random(Random *this)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  
  std::random_device::random_device(&this->_rd);
  uVar1 = std::random_device::_M_getval();
  uVar2 = (ulong)uVar1;
  (this->_mt)._M_x[0] = uVar2;
  lVar3 = 1;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    (this->_mt)._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  (this->_mt)._M_p = 0x270;
  (this->_dist)._M_param._M_a = 1.0;
  (this->_dist)._M_param._M_b = 10.0;
  return;
}

Assistant:

Random()
        : _mt(_rd()), _dist(1.0, 10.0)
    { }